

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdpp.h
# Opt level: O0

bool __thiscall GD::Image::CreateFromPng(Image *this,istream *in)

{
  gdImagePtr pgVar1;
  undefined1 local_60 [8];
  istreamIOCtx _in_ctx;
  istream *in_local;
  Image *this_local;
  
  _in_ctx._M_stream = in;
  clear(this);
  istreamIOCtx::istreamIOCtx((istreamIOCtx *)local_60,_in_ctx._M_stream);
  pgVar1 = gdImageCreateFromPngCtx((gdIOCtx *)local_60);
  *(gdImagePtr *)this = pgVar1;
  return pgVar1 != (gdImagePtr)0x0;
}

Assistant:

bool CreateFromPng(std::istream & in) {
		clear();
		istreamIOCtx _in_ctx(in);
		return ((im = gdImageCreateFromPngCtx( & _in_ctx)) != 0);
	}